

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# img.cpp
# Opt level: O0

bool __thiscall
tg::Img<glm::vec<3,_float,_(glm::qualifier)0>_>::save
          (Img<glm::vec<3,_float,_(glm::qualifier)0>_> *this,char *fileName,int quality)

{
  int iVar1;
  int quality_local;
  char *fileName_local;
  Img<glm::vec<3,_float,_(glm::qualifier)0>_> *this_local;
  
  iVar1 = saveImgFloatN<3>(fileName,(this->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>).
                                    _data,
                           (this->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._w,
                           (this->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._h,
                           (this->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._stride,
                           quality);
  return iVar1 != 0;
}

Assistant:

bool Img<vec3>::save(const char* fileName, int quality)
{
    return saveImgFloatN<3>(fileName, _data, _w, _h, _stride, quality);
}